

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaConfig.cpp
# Opt level: O2

vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> * __thiscall
xmrig::CudaConfig::get
          (vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>
           *__return_storage_ptr__,CudaConfig *this,Miner *miner,
          vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *devices)

{
  pointer pCVar1;
  pointer pCVar2;
  CudaThreads *pCVar3;
  char *pcVar4;
  uint uVar5;
  CudaThread *thread;
  pointer pCVar6;
  Miner *miner_local;
  
  (__return_storage_ptr__->
  super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  miner_local = miner;
  pCVar3 = Threads<xmrig::CudaThreads>::get(&this->m_threads);
  pCVar6 = (pCVar3->m_data).
           super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (pCVar3->m_data).
           super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar6 != pCVar1) {
    std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::reserve
              (__return_storage_ptr__,(long)pCVar1 - (long)pCVar6 >> 5);
    pCVar1 = (pCVar3->m_data).
             super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar6 = (pCVar3->m_data).
                  super__Vector_base<xmrig::CudaThread,_std::allocator<xmrig::CudaThread>_>._M_impl.
                  super__Vector_impl_data._M_start; pCVar6 != pCVar1; pCVar6 = pCVar6 + 1) {
      pCVar2 = (devices->super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>).
               _M_impl.super__Vector_impl_data._M_start;
      for (uVar5 = 0;
          (ulong)uVar5 <
          (ulong)(((long)(devices->
                         super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pCVar2) / 0x30);
          uVar5 = uVar5 + 1) {
        if (pCVar2[uVar5].m_index == pCVar6->m_index) {
          if (uVar5 != 0xffffffff) {
            std::vector<xmrig::CudaLaunchData,std::allocator<xmrig::CudaLaunchData>>::
            emplace_back<xmrig::Miner_const*&,xmrig::CudaThread_const&,xmrig::CudaDevice_const&>
                      ((vector<xmrig::CudaLaunchData,std::allocator<xmrig::CudaLaunchData>> *)
                       __return_storage_ptr__,&miner_local,pCVar6,pCVar2 + (int)uVar5);
            goto LAB_00175203;
          }
          break;
        }
      }
      pcVar4 = cuda_tag();
      Log::print(INFO,"%s\x1b[0;33m skip non-existing device with index \x1b[0m\x1b[1;33m%u\x1b[0m",
                 pcVar4,(ulong)pCVar6->m_index);
LAB_00175203:
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<xmrig::CudaLaunchData> xmrig::CudaConfig::get(const Miner *miner, const std::vector<CudaDevice> &devices) const
{
    auto deviceIndex = [&devices](uint32_t index) -> int {
        for (uint32_t i = 0; i < devices.size(); ++i) {
            if (devices[i].index() == index) {
                return i;
            }
        }

        return -1;
    };

    std::vector<CudaLaunchData> out;
    const auto &threads = m_threads.get();

    if (threads.isEmpty()) {
        return out;
    }

    out.reserve(threads.count());

    for (const auto &thread : threads.data()) {
        const int index = deviceIndex(thread.index());
        if (index == -1) {
            LOG_INFO("%s" YELLOW(" skip non-existing device with index ") YELLOW_BOLD("%u"), cuda_tag(), thread.index());
            continue;
        }

        out.emplace_back(miner, thread, devices[static_cast<size_t>(index)]);
    }

    return out;
}